

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance.h
# Opt level: O1

PrimInfo * __thiscall
embree::avx::InstanceISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,InstanceISA *this,PrimRef *prims,range<unsigned_long> *r
          ,size_t k,uint geomID)

{
  AffineSpace3ff *pAVar1;
  long lVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined4 uVar10;
  float fVar11;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar12 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar40 [16];
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar50;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar51;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  aVar50.m128[2] = INFINITY;
  aVar50._0_8_ = 0x7f8000007f800000;
  aVar50.m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar50;
  aVar51.m128[2] = -INFINITY;
  aVar51._0_8_ = 0xff800000ff800000;
  aVar51.m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar51;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar50;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar51;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  pAVar1 = (this->super_Instance).local2world;
  if ((this->super_Instance).super_Geometry.field_8.field_0x1 == '\x01') {
    createPrimRefArray();
    aVar51.m128[2] = -INFINITY;
    aVar51._0_8_ = 0xff800000ff800000;
    aVar51.m128[3] = -INFINITY;
    aVar50.m128[2] = INFINITY;
    aVar50._0_8_ = 0x7f8000007f800000;
    aVar50.m128[3] = INFINITY;
  }
  else {
    fVar11 = (pAVar1->l).vx.field_0.m128[0];
    fVar13 = (pAVar1->l).vx.field_0.m128[1];
    fVar14 = (pAVar1->l).vx.field_0.m128[2];
    fVar15 = (pAVar1->l).vx.field_0.m128[3];
    fVar16 = (pAVar1->l).vy.field_0.m128[0];
    fVar17 = (pAVar1->l).vy.field_0.m128[1];
    fVar18 = (pAVar1->l).vy.field_0.m128[2];
    fVar19 = (pAVar1->l).vy.field_0.m128[3];
    fVar6 = (pAVar1->l).vz.field_0.m128[0];
    fVar7 = (pAVar1->l).vz.field_0.m128[1];
    fVar8 = (pAVar1->l).vz.field_0.m128[2];
    fVar9 = (pAVar1->l).vz.field_0.m128[3];
    fVar20 = (pAVar1->p).field_0.m128[0];
    fVar24 = (pAVar1->p).field_0.m128[1];
    fVar25 = (pAVar1->p).field_0.m128[2];
    fVar26 = (pAVar1->p).field_0.m128[3];
    lVar2 = *(long *)&(this->super_Instance).super_Geometry.field_0x58;
    auVar48 = vminps_avx(*(undefined1 (*) [16])(lVar2 + 0x10),*(undefined1 (*) [16])(lVar2 + 0x30));
    auVar34 = vmaxps_avx(*(undefined1 (*) [16])(lVar2 + 0x20),*(undefined1 (*) [16])(lVar2 + 0x40));
    auVar12 = vshufps_avx(auVar48,auVar48,0);
    auVar21 = vshufps_avx(auVar48,auVar48,0x55);
    auVar48 = vshufps_avx(auVar48,auVar48,0xaa);
    fVar30 = fVar20 + fVar6 * auVar48._0_4_;
    fVar31 = fVar24 + fVar7 * auVar48._4_4_;
    fVar32 = fVar25 + fVar8 * auVar48._8_4_;
    fVar33 = fVar26 + fVar9 * auVar48._12_4_;
    fVar39 = fVar16 * auVar21._0_4_;
    fVar41 = fVar17 * auVar21._4_4_;
    fVar42 = fVar18 * auVar21._8_4_;
    fVar43 = fVar19 * auVar21._12_4_;
    fVar44 = fVar39 + fVar30;
    fVar45 = fVar41 + fVar31;
    fVar46 = fVar42 + fVar32;
    fVar47 = fVar43 + fVar33;
    fVar35 = fVar11 * auVar12._0_4_;
    fVar36 = fVar13 * auVar12._4_4_;
    fVar37 = fVar14 * auVar12._8_4_;
    fVar38 = fVar15 * auVar12._12_4_;
    auVar48._0_4_ = fVar44 + fVar35;
    auVar48._4_4_ = fVar45 + fVar36;
    auVar48._8_4_ = fVar46 + fVar37;
    auVar48._12_4_ = fVar47 + fVar38;
    auVar12 = vminps_avx((undefined1  [16])aVar50,auVar48);
    auVar48 = vmaxps_avx((undefined1  [16])aVar51,auVar48);
    auVar21 = vshufps_avx(auVar34,auVar34,0xaa);
    fVar20 = fVar20 + auVar21._0_4_ * fVar6;
    fVar24 = fVar24 + auVar21._4_4_ * fVar7;
    fVar25 = fVar25 + auVar21._8_4_ * fVar8;
    fVar26 = fVar26 + auVar21._12_4_ * fVar9;
    fVar39 = fVar39 + fVar20;
    fVar41 = fVar41 + fVar24;
    fVar42 = fVar42 + fVar25;
    fVar43 = fVar43 + fVar26;
    auVar40._0_4_ = fVar35 + fVar39;
    auVar40._4_4_ = fVar36 + fVar41;
    auVar40._8_4_ = fVar37 + fVar42;
    auVar40._12_4_ = fVar38 + fVar43;
    auVar12 = vminps_avx(auVar12,auVar40);
    auVar48 = vmaxps_avx(auVar48,auVar40);
    auVar21 = vshufps_avx(auVar34,auVar34,0x55);
    fVar16 = auVar21._0_4_ * fVar16;
    fVar17 = auVar21._4_4_ * fVar17;
    fVar18 = auVar21._8_4_ * fVar18;
    fVar19 = auVar21._12_4_ * fVar19;
    fVar30 = fVar30 + fVar16;
    fVar31 = fVar31 + fVar17;
    fVar32 = fVar32 + fVar18;
    fVar33 = fVar33 + fVar19;
    auVar49._0_4_ = fVar35 + fVar30;
    auVar49._4_4_ = fVar36 + fVar31;
    auVar49._8_4_ = fVar37 + fVar32;
    auVar49._12_4_ = fVar38 + fVar33;
    auVar12 = vminps_avx(auVar12,auVar49);
    auVar48 = vmaxps_avx(auVar48,auVar49);
    fVar16 = fVar16 + fVar20;
    fVar17 = fVar17 + fVar24;
    fVar18 = fVar18 + fVar25;
    fVar19 = fVar19 + fVar26;
    auVar21._0_4_ = fVar35 + fVar16;
    auVar21._4_4_ = fVar36 + fVar17;
    auVar21._8_4_ = fVar37 + fVar18;
    auVar21._12_4_ = fVar38 + fVar19;
    auVar12 = vminps_avx(auVar12,auVar21);
    auVar48 = vmaxps_avx(auVar48,auVar21);
    auVar34 = vshufps_avx(auVar34,auVar34,0);
    fVar11 = fVar11 * auVar34._0_4_;
    fVar13 = fVar13 * auVar34._4_4_;
    fVar14 = fVar14 * auVar34._8_4_;
    fVar15 = fVar15 * auVar34._12_4_;
    auVar34._0_4_ = fVar44 + fVar11;
    auVar34._4_4_ = fVar45 + fVar13;
    auVar34._8_4_ = fVar46 + fVar14;
    auVar34._12_4_ = fVar47 + fVar15;
    auVar12 = vminps_avx(auVar12,auVar34);
    auVar34 = vmaxps_avx(auVar48,auVar34);
    auVar27._0_4_ = fVar11 + fVar39;
    auVar27._4_4_ = fVar13 + fVar41;
    auVar27._8_4_ = fVar14 + fVar42;
    auVar27._12_4_ = fVar15 + fVar43;
    auVar48 = vminps_avx(auVar12,auVar27);
    auVar34 = vmaxps_avx(auVar34,auVar27);
    auVar28._0_4_ = fVar11 + fVar30;
    auVar28._4_4_ = fVar13 + fVar31;
    auVar28._8_4_ = fVar14 + fVar32;
    auVar28._12_4_ = fVar15 + fVar33;
    auVar48 = vminps_avx(auVar48,auVar28);
    auVar34 = vmaxps_avx(auVar34,auVar28);
    auVar12._0_4_ = fVar11 + fVar16;
    auVar12._4_4_ = fVar13 + fVar17;
    auVar12._8_4_ = fVar14 + fVar18;
    auVar12._12_4_ = fVar15 + fVar19;
    local_58 = vminps_avx(auVar48,auVar12);
    local_48 = vmaxps_avx(auVar34,auVar12);
  }
  auVar22._8_4_ = 0xddccb9a2;
  auVar22._0_8_ = 0xddccb9a2ddccb9a2;
  auVar22._12_4_ = 0xddccb9a2;
  auVar34 = vcmpps_avx(local_58,auVar22,6);
  auVar29._8_4_ = 0x5dccb9a2;
  auVar29._0_8_ = 0x5dccb9a25dccb9a2;
  auVar29._12_4_ = 0x5dccb9a2;
  auVar48 = vcmpps_avx(local_48,auVar29,1);
  auVar34 = vandps_avx(auVar34,auVar48);
  uVar10 = vmovmskps_avx(auVar34);
  if ((~(byte)uVar10 & 7) == 0) {
    aVar4 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
            vinsertps_avx(local_58,ZEXT416(geomID),0x30);
    aVar3 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
            vblendps_avx(local_48,ZEXT816(0),8);
    aVar5.m128 = (__m128)vminps_avx(aVar50.m128,(undefined1  [16])aVar4);
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = aVar5;
    aVar5.m128 = (__m128)vmaxps_avx(aVar51.m128,(undefined1  [16])aVar3);
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = aVar5;
    auVar23._0_4_ = aVar3.x + aVar4.x;
    auVar23._4_4_ = aVar3.y + aVar4.y;
    auVar23._8_4_ = aVar3.z + aVar4.z;
    auVar23._12_4_ = aVar3.field_3.w + aVar4.field_3.w;
    aVar50.m128 = (__m128)vminps_avx(aVar50.m128,auVar23);
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = aVar50;
    aVar50.m128 = (__m128)vmaxps_avx(aVar51.m128,auVar23);
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = aVar50;
    __return_storage_ptr__->end = 1;
    prims[k].upper.field_0.field_1 = aVar3;
    prims[k].lower.field_0.field_1 = aVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        assert(r.begin() == 0);
        assert(r.end()   == 1);

        PrimInfo pinfo(empty);
        BBox3fa b = empty;
        if (!buildBounds(0,&b)) return pinfo;
        // const BBox3fa b = bounds(0);
        // if (!isvalid(b)) return pinfo;

        const PrimRef prim(b,geomID,unsigned(0));
        pinfo.add_center2(prim);
        prims[k++] = prim;
        return pinfo;
      }